

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall spv::Builder::simplifyAccessChainSwizzle(Builder *this)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  uint local_14;
  uint i;
  Builder *this_local;
  
  iVar1 = getNumTypeComponents(this,(this->accessChain).preSwizzleBaseType);
  sVar2 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::size
                    (&(this->accessChain).swizzle);
  if (iVar1 <= (int)sVar2) {
    for (local_14 = 0;
        sVar2 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::size
                          (&(this->accessChain).swizzle), local_14 < sVar2; local_14 = local_14 + 1)
    {
      pvVar3 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::operator[]
                         (&(this->accessChain).swizzle,(ulong)local_14);
      if (local_14 != *pvVar3) {
        return;
      }
    }
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::clear
              (&(this->accessChain).swizzle);
    if ((this->accessChain).component == 0) {
      (this->accessChain).preSwizzleBaseType = 0;
    }
  }
  return;
}

Assistant:

void Builder::simplifyAccessChainSwizzle()
{
    // If the swizzle has fewer components than the vector, it is subsetting, and must stay
    // to preserve that fact.
    if (getNumTypeComponents(accessChain.preSwizzleBaseType) > (int)accessChain.swizzle.size())
        return;

    // if components are out of order, it is a swizzle
    for (unsigned int i = 0; i < accessChain.swizzle.size(); ++i) {
        if (i != accessChain.swizzle[i])
            return;
    }

    // otherwise, there is no need to track this swizzle
    accessChain.swizzle.clear();
    if (accessChain.component == NoResult)
        accessChain.preSwizzleBaseType = NoType;
}